

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_color_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  byte bVar1;
  color_quad_u8 cVar2;
  uint uVar3;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar4;
  uint uVar5;
  uint *puVar6;
  unsigned_short *puVar7;
  byte *pbVar8;
  vector<unsigned_char> *other;
  uint *local_338;
  static_huffman_data_model *local_320;
  static_huffman_data_model *local_2c0;
  color_quad<unsigned_char,_int> *local_280;
  color_quad<unsigned_char,_int> *local_258;
  uint *local_230;
  uint table_1;
  uint sym_1;
  uint i_2;
  undefined1 local_1e0 [4];
  uint i_1;
  symbol_codec codec;
  undefined1 auStack_d8 [16];
  int table;
  int sym;
  int delta;
  uint k;
  uint j;
  color_quad<unsigned_char,_int> local_b4 [2];
  color_quad_u8 cur [2];
  uint endpoint;
  uint endpoint_index;
  int total_residuals;
  color_quad_u8 prev [2];
  vector<unsigned_int> residual_syms;
  symbol_histogram hist [2];
  uint component_limits [6];
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  vector<unsigned_int> remapped_endpoints;
  vector<unsigned_short> *remapping_local;
  vector<unsigned_char> *packed_data_local;
  crn_comp *this_local;
  
  remapped_endpoints._8_8_ = remapping;
  uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_38,uVar3);
  local_3c = 0;
  while( true ) {
    uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
    if (uVar3 <= local_3c) break;
    puVar6 = vector<unsigned_int>::operator[](&this->m_color_endpoints,local_3c);
    uVar5 = *puVar6;
    puVar7 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)remapped_endpoints._8_8_,local_3c);
    puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_38,(uint)*puVar7);
    *puVar6 = uVar5;
    local_3c = local_3c + 1;
  }
  hist[1].m_hist.m_size = 0x1f;
  hist[1].m_hist.m_capacity = 0x3f;
  local_230 = &residual_syms.m_size;
  do {
    symbol_histogram::symbol_histogram((symbol_histogram *)local_230,0);
    local_230 = local_230 + 4;
  } while (local_230 != &hist[1].m_hist.m_size);
  symbol_histogram::resize((symbol_histogram *)&residual_syms.m_size,0x20);
  symbol_histogram::resize((symbol_histogram *)&hist[0].m_hist.m_size,0x40);
  vector<unsigned_int>::vector((vector<unsigned_int> *)prev);
  uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)prev,uVar3 * 6);
  local_258 = (color_quad<unsigned_char,_int> *)&endpoint_index;
  do {
    color_quad<unsigned_char,_int>::color_quad(local_258);
    local_258 = local_258 + 1;
  } while (local_258 != prev);
  color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)&endpoint_index);
  color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)&total_residuals);
  cur[1].field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       0x0;
  while( true ) {
    cVar2.field_0 = cur[1].field_0;
    aVar4.m_u32 = vector<unsigned_int>::size(&this->m_color_endpoints);
    if (aVar4.m_u32 <= (uint)cVar2.field_0) break;
    puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_38,(uint)cur[1].field_0)
    ;
    cur[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)*puVar6;
    local_280 = local_b4;
    do {
      color_quad<unsigned_char,_int>::color_quad(local_280);
      local_280 = local_280 + 1;
    } while (local_280 != cur);
    dxt1_block::unpack_color((dxt1_block *)&j,(undefined2)cur[0].field_0.m_u32,false,0xff);
    color_quad<unsigned_char,_int>::operator=(local_b4,(color_quad<unsigned_char,_int> *)&j);
    dxt1_block::unpack_color((dxt1_block *)&k,cur[0].field_0.m_u32._2_2_,false,0xff);
    color_quad<unsigned_char,_int>::operator=(local_b4 + 1,(color_quad<unsigned_char,_int> *)&k);
    for (delta = 0; (uint)delta < 2; delta = delta + 1) {
      for (sym = 0; (uint)sym < 3; sym = sym + 1) {
        pbVar8 = color_quad<unsigned_char,_int>::operator[](local_b4 + (uint)delta,sym);
        bVar1 = *pbVar8;
        pbVar8 = color_quad<unsigned_char,_int>::operator[]
                           ((color_quad<unsigned_char,_int> *)(&endpoint_index + (uint)delta),sym);
        table = (uint)bVar1 - (uint)*pbVar8;
        auStack_d8._12_4_ = table & component_limits[(ulong)(uint)(delta * 3 + sym) - 2];
        auStack_d8._8_4_ = ZEXT14(sym == 1);
        symbol_histogram::inc_freq
                  ((symbol_histogram *)&hist[(long)(int)auStack_d8._8_4_ + -1].m_hist.m_size,
                   auStack_d8._12_4_,1);
        auStack_d8._4_4_ = auStack_d8._12_4_;
        vector<unsigned_int>::push_back((vector<unsigned_int> *)prev,(uint *)(auStack_d8 + 4));
      }
    }
    color_quad<unsigned_char,_int>::operator=
              ((color_quad<unsigned_char,_int> *)&endpoint_index,local_b4);
    color_quad<unsigned_char,_int>::operator=
              ((color_quad<unsigned_char,_int> *)&total_residuals,local_b4 + 1);
    cur[1].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)((int)cur[1].field_0 + 1);
  }
  local_2c0 = (static_huffman_data_model *)&codec.m_support_arith;
  do {
    static_huffman_data_model::static_huffman_data_model(local_2c0);
    local_2c0 = local_2c0 + 1;
  } while (local_2c0 != (static_huffman_data_model *)auStack_d8);
  symbol_codec::symbol_codec((symbol_codec *)local_1e0);
  symbol_codec::start_encoding((symbol_codec *)local_1e0,0x100000);
  i_2 = 0;
  do {
    if (1 < i_2) {
      table_1 = 0;
      while( true ) {
        uVar3 = vector<unsigned_int>::size((vector<unsigned_int> *)prev);
        if (uVar3 <= table_1) break;
        puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)prev,table_1);
        symbol_codec::encode
                  ((symbol_codec *)local_1e0,*puVar6,
                   (static_huffman_data_model *)
                   (&codec.m_support_arith +
                   (ulong)(table_1 * -0x55555555 + 0x55555555 < 0x55555555) * 0x38));
        table_1 = table_1 + 1;
      }
      symbol_codec::stop_encoding((symbol_codec *)local_1e0,false);
      other = symbol_codec::get_encoding_buf((symbol_codec *)local_1e0);
      vector<unsigned_char>::swap(packed_data,other);
      this_local._7_1_ = true;
LAB_001b10a9:
      symbol_codec::~symbol_codec((symbol_codec *)local_1e0);
      local_320 = (static_huffman_data_model *)auStack_d8;
      do {
        local_320 = local_320 + -1;
        static_huffman_data_model::~static_huffman_data_model(local_320);
      } while (local_320 != (static_huffman_data_model *)&codec.m_support_arith);
      vector<unsigned_int>::~vector((vector<unsigned_int> *)prev);
      local_338 = &hist[1].m_hist.m_size;
      do {
        local_338 = local_338 + -4;
        symbol_histogram::~symbol_histogram((symbol_histogram *)local_338);
      } while (local_338 != &residual_syms.m_size);
      vector<unsigned_int>::~vector((vector<unsigned_int> *)local_38);
      return this_local._7_1_;
    }
    uVar5 = static_huffman_data_model::init
                      ((static_huffman_data_model *)(&codec.m_support_arith + (ulong)i_2 * 0x38),
                       (EVP_PKEY_CTX *)0x1);
    if ((uVar5 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001b10a9;
    }
    uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                      ((symbol_codec *)local_1e0,
                       (static_huffman_data_model *)(&codec.m_support_arith + (ulong)i_2 * 0x38),
                       false,(static_huffman_data_model *)0x0);
    if (uVar3 == 0) {
      this_local._7_1_ = false;
      goto LAB_001b10a9;
    }
    i_2 = i_2 + 1;
  } while( true );
}

Assistant:

bool crn_comp::pack_color_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_color_endpoints.size());

        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_color_endpoints[i];
        }

        const uint component_limits[6] = { 31, 63, 31, 31, 63, 31 };

        symbol_histogram hist[2];
        hist[0].resize(32);
        hist[1].resize(64);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_color_endpoints.size() * 2 * 3);

        color_quad_u8 prev[2];
        prev[0].clear();
        prev[1].clear();

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_color_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            color_quad_u8 cur[2];
            cur[0] = dxt1_block::unpack_color((uint16)(endpoint & 0xFFFF), false);
            cur[1] = dxt1_block::unpack_color((uint16)((endpoint >> 16) & 0xFFFF), false);

            for (uint j = 0; j < 2; j++)
            {
                for (uint k = 0; k < 3; k++)
                {
                    int delta = cur[j][k] - prev[j][k];
                    total_residuals += delta * delta;
                    int sym = delta & component_limits[j * 3 + k];
                    int table = (k == 1) ? 1 : 0;
                    hist[table].inc_freq(sym);
                    residual_syms.push_back(sym);
                }
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm[2];

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        for (uint i = 0; i < 2; i++)
        {
            if (!residual_dm[i].init(true, hist[i], 15))
            {
                return false;
            }

            if (!codec.encode_transmit_static_huffman_data_model(residual_dm[i], false))
            {
                return false;
            }
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            const uint table = ((i % 3) == 1) ? 1 : 0;
            codec.encode(sym, residual_dm[table]);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }